

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O2

MainFunc __thiscall capnp::compiler::CompilerMain::getGenIdMain(CompilerMain *this)

{
  StringPtr extendedDescription;
  Iface *extraout_RDX;
  long in_RSI;
  MainFunc MVar1;
  StringPtr version;
  StringPtr briefDescription;
  Own<kj::Function<kj::MainBuilder::Validity_()>::Iface,_std::nullptr_t> local_50;
  MainBuilder local_40;
  char *local_30;
  undefined8 uStack_28;
  BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:129:27),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:129:27)>
  local_20;
  
  local_30 = "";
  uStack_28 = 1;
  extendedDescription.content.size_ = 1;
  extendedDescription.content.ptr = "";
  version.content.size_ = 0x1c;
  version.content.ptr = "Cap\'n Proto version 2.0-dev";
  briefDescription.content.size_ = 0x42;
  briefDescription.content.ptr =
       "Generates a new 64-bit unique ID for use in a Cap\'n Proto schema.";
  kj::MainBuilder::MainBuilder
            (&local_40,*(ProcessContext **)(in_RSI + 8),version,briefDescription,extendedDescription
            );
  kj::Function<kj::MainBuilder::Validity()>::
  Function<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getGenIdMain()::_lambda(auto:1&,(auto:2&&)___)_1_,capnp::compiler::CompilerMain::getGenIdMain()::_lambda(auto:1&,(auto:2&&)___)_2_>>
            ((Function<kj::MainBuilder::Validity()> *)&local_50,&local_20);
  kj::MainBuilder::callAfterParsing(&local_40,(Function<kj::MainBuilder::Validity_()> *)&local_50);
  kj::MainBuilder::build((MainBuilder *)this);
  kj::Own<kj::Function<kj::MainBuilder::Validity_()>::Iface,_std::nullptr_t>::dispose(&local_50);
  kj::MainBuilder::~MainBuilder(&local_40);
  MVar1.impl.ptr = extraout_RDX;
  MVar1.impl.disposer = (Disposer *)this;
  return (MainFunc)MVar1.impl;
}

Assistant:

kj::MainFunc getGenIdMain() {
    return kj::MainBuilder(context, VERSION_STRING,
          "Generates a new 64-bit unique ID for use in a Cap'n Proto schema.")
        .callAfterParsing(KJ_BIND_METHOD(*this, generateId))
        .build();
  }